

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  
  if ((*(byte *)(in_RDX + 0x48) & 1) == 0) {
    ImFont::ClearOutputData((ImFont *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
    *(undefined4 *)(in_RSI + 0x14) = *(undefined4 *)(in_RDX + 0x14);
    *(long *)(in_RSI + 0x48) = in_RDX;
    *(undefined2 *)(in_RSI + 0x50) = 0;
    *(undefined8 *)(in_RSI + 0x40) = in_RDI;
    *(undefined4 *)(in_RSI + 0x5c) = in_XMM0_Da;
    *(undefined4 *)(in_RSI + 0x60) = in_XMM1_Da;
  }
  *(short *)(in_RSI + 0x50) = *(short *)(in_RSI + 0x50) + 1;
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ClearOutputData();
        font->FontSize = font_config->SizePixels;
        font->ConfigData = font_config;
        font->ConfigDataCount = 0;
        font->ContainerAtlas = atlas;
        font->Ascent = ascent;
        font->Descent = descent;
    }
    font->ConfigDataCount++;
}